

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O0

Value __thiscall
MiniScript::Parser::ParseAddSub(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  ParseState *this_00;
  long *plVar1;
  undefined7 in_register_00000011;
  Lexer *other;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data aVar2;
  byte in_R8B;
  bool bVar3;
  Value VVar4;
  code *local_208;
  bool local_1eb;
  bool local_1ea;
  bool local_1e9;
  Token local_1a0;
  Value local_180;
  Value local_170;
  Value local_160;
  Value local_150;
  TACLine local_140;
  int local_dc;
  int tempNum;
  undefined1 local_d0 [8];
  Value opB;
  undefined1 local_b0 [56];
  undefined1 local_78 [8];
  Token tok;
  Lexer local_48;
  byte local_39;
  code *local_38;
  offset_in_Parser_to_subr nextLevel;
  byte local_22;
  byte local_21;
  bool statementStart_local;
  Lexer *pLStack_20;
  bool asLval_local;
  Lexer *tokens_local;
  Parser *this_local;
  Value *val;
  
  other = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_22 = in_R8B & 1;
  local_38 = ParseMultDiv;
  nextLevel = 0;
  local_39 = 0;
  local_21 = statementStart;
  pLStack_20 = other;
  tokens_local = tokens;
  this_local = this;
  Lexer::Lexer(&local_48,other);
  ParseMultDiv(this,tokens,SUB81(&local_48,0),(bool)(local_21 & 1));
  Lexer::~Lexer(&local_48);
  Lexer::Peek((Token *)local_78,other);
  while( true ) {
    local_1e9 = true;
    if (local_78._0_4_ != OpPlus) {
      local_1ea = false;
      if (local_78._0_4_ == OpMinus) {
        local_1eb = true;
        if (((local_22 & 1) != 0) && (local_1eb = true, (tok.text.isTemp & 1U) != 0)) {
          local_1eb = Lexer::isAtWhitespace(other);
        }
        local_1ea = local_1eb;
      }
      local_1e9 = local_1ea;
    }
    if (local_1e9 == false) break;
    Lexer::Dequeue((Token *)(local_b0 + 0x18),other);
    Token::~Token((Token *)(local_b0 + 0x18));
    Lexer::Lexer((Lexer *)(local_b0 + 0x10),other);
    AllowLineBreak((Lexer *)(local_b0 + 0x10));
    Lexer::~Lexer((Lexer *)(local_b0 + 0x10));
    Value::Value((Value *)&opB.data,(Value *)this);
    FullyEvaluate((Parser *)local_b0,(Value *)tokens,(char)&opB + 8);
    Value::operator=((Value *)this,(Value *)local_b0);
    Value::~Value((Value *)local_b0);
    Value::~Value((Value *)&opB.data);
    plVar1 = (long *)((long)&tokens->ls + nextLevel);
    if (((ulong)local_38 & 1) == 0) {
      local_208 = local_38;
    }
    else {
      local_208 = *(code **)(local_38 + *plVar1 + -1);
    }
    Lexer::Lexer((Lexer *)&stack0xffffffffffffff28,other);
    (*local_208)(local_d0,plVar1,&stack0xffffffffffffff28,0);
    Lexer::~Lexer((Lexer *)&stack0xffffffffffffff28);
    local_dc = *(int *)&((tokens[6].ls)->pending).ls;
    *(int *)&((tokens[6].ls)->pending).ls = local_dc + 1;
    this_00 = (ParseState *)tokens[6].ls;
    Value::Temp(&local_150,local_dc);
    bVar3 = local_78._0_4_ != OpPlus;
    Value::Value(&local_160,(Value *)this);
    Value::Value(&local_170,(Value *)local_d0);
    TACLine::TACLine(&local_140,&local_150,bVar3 + APlusB,&local_160,&local_170);
    ParseState::Add(this_00,&local_140);
    TACLine::~TACLine(&local_140);
    Value::~Value(&local_170);
    Value::~Value(&local_160);
    Value::~Value(&local_150);
    Value::Temp(&local_180,local_dc);
    Value::operator=((Value *)this,&local_180);
    Value::~Value(&local_180);
    Lexer::Peek(&local_1a0,other);
    Token::operator=((Token *)local_78,&local_1a0);
    Token::~Token(&local_1a0);
    Value::~Value((Value *)local_d0);
  }
  local_39 = 1;
  Token::~Token((Token *)local_78);
  aVar2 = extraout_RDX;
  if ((local_39 & 1) == 0) {
    Value::~Value((Value *)this);
    aVar2 = extraout_RDX_00;
  }
  VVar4.data.number = aVar2.number;
  VVar4._0_8_ = this;
  return VVar4;
}

Assistant:

Value Parser::ParseAddSub(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseMultDiv;
		Value val = (*this.*nextLevel)(tokens, asLval, statementStart);
		Token tok = tokens.Peek();
		while (tok.type == Token::Type::OpPlus ||
			   (tok.type == Token::Type::OpMinus
				&& (!statementStart || !tok.afterSpace  || tokens.isAtWhitespace()))) {
			tokens.Dequeue();

			AllowLineBreak(tokens); // allow a line break after a binary operator
				   
			val = FullyEvaluate(val);
			Value opB = (*this.*nextLevel)(tokens, false, false);
			int tempNum = output->nextTempNum++;
			output->Add(TACLine(Value::Temp(tempNum),
							   tok.type == Token::Type::OpPlus ? TACLine::Op::APlusB : TACLine::Op::AMinusB,
							   val, opB));
			val = Value::Temp(tempNum);
			
			tok = tokens.Peek();
		}
		return val;
	}